

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.hpp
# Opt level: O0

void Shell::Shuffling::shuffleList<unsigned_int>(List<unsigned_int> **list)

{
  List<unsigned_int> **ppLVar1;
  List<unsigned_int> *l;
  ulong n;
  undefined8 *in_RDI;
  List<unsigned_int> *res;
  List<unsigned_int> *els;
  uint idx;
  DArray<Lib::List<unsigned_int>_*> aux;
  uint len;
  DArray<Lib::List<unsigned_int>_*> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  DArray<Lib::List<unsigned_int>_*> *in_stack_ffffffffffffffa0;
  DArray<Lib::List<unsigned_int>_*> *local_50;
  DArray<Lib::List<unsigned_int>_*> *local_38;
  uint local_2c;
  DArray<Lib::List<unsigned_int>_*> local_28;
  uint local_c;
  undefined8 *local_8;
  
  local_8 = in_RDI;
  local_c = Lib::List<unsigned_int>::length((List<unsigned_int> *)in_stack_ffffffffffffff90);
  if (1 < local_c) {
    Lib::DArray<Lib::List<unsigned_int>_*>::DArray
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_2c = 0;
    for (local_38 = (DArray<Lib::List<unsigned_int>_*> *)*local_8;
        local_38 != (DArray<Lib::List<unsigned_int>_*> *)0x0;
        local_38 = (DArray<Lib::List<unsigned_int>_*> *)
                   Lib::List<unsigned_int>::tail((List<unsigned_int> *)local_38)) {
      n = (ulong)local_2c;
      local_2c = local_2c + 1;
      in_stack_ffffffffffffffa0 = local_38;
      ppLVar1 = Lib::DArray<Lib::List<unsigned_int>_*>::operator[](&local_28,n);
      *ppLVar1 = (List<unsigned_int> *)in_stack_ffffffffffffffa0;
    }
    shuffleArray<Lib::DArray<Lib::List<unsigned_int>*>>
              (in_stack_ffffffffffffffa0,(uint)(in_stack_ffffffffffffff98 >> 0x20));
    local_50 = (DArray<Lib::List<unsigned_int>_*> *)0x0;
    for (local_2c = 0; local_2c < local_c; local_2c = local_2c + 1) {
      l = (List<unsigned_int> *)
          Lib::DArray<Lib::List<unsigned_int>_*>::operator[](&local_28,(ulong)local_2c);
      Lib::List<unsigned_int>::head(*(List<unsigned_int> **)l);
      in_stack_ffffffffffffff90 =
           (DArray<Lib::List<unsigned_int>_*> *)
           Lib::List<unsigned_int>::cons((uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20),l);
      local_50 = in_stack_ffffffffffffff90;
    }
    *local_8 = local_50;
    Lib::DArray<Lib::List<unsigned_int>_*>::~DArray(in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

static void shuffleList(List<T>*& list) {
    unsigned len = List<T>::length(list);

    if (len <= 1) {
      return;
    }

    DArray<List<T>*> aux(len);
    unsigned idx = 0;

    List<T>* els = list;
    while (els != nullptr) {
      aux[idx++] = els;
      els = els->tail();
    }
    shuffleArray(aux,len);

    // create the new list
    List<T>* res = nullptr;
    for(idx = 0; idx < len; idx++) {
      res = List<T>::cons(aux[idx]->head(),res);
    }

    // List<T>::destroy(list);
    list = res;
  }